

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O1

int anon_unknown.dwarf_29d038f::ConvolveScaleTestBase<unsigned_short>::RandomSubpel(ACMRandom *rnd)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
  uVar2 = uVar1 >> 0x17 & 7;
  if ((uVar1 >> 0x17 & 7) != 0) {
    if (uVar2 == 1) {
      uVar2 = 0x3ff;
    }
    else {
      uVar1 = testing::internal::Random::Generate(&rnd->random_,0x3fe);
      uVar2 = uVar1 + 1;
    }
  }
  return uVar2;
}

Assistant:

static int RandomSubpel(ACMRandom *rnd) {
    const uint8_t subpel_mode = rnd->Rand8();
    if ((subpel_mode & 7) == 0) {
      return 0;
    } else if ((subpel_mode & 7) == 1) {
      return SCALE_SUBPEL_SHIFTS - 1;
    } else {
      return 1 + rnd->PseudoUniform(SCALE_SUBPEL_SHIFTS - 2);
    }
  }